

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Btree * findBtree(sqlite3 *pErrorDb,sqlite3 *pDb,char *zDb)

{
  int iVar1;
  undefined1 auStack_280 [4];
  int rc;
  Parse sParse;
  int i;
  char *zDb_local;
  sqlite3 *pDb_local;
  sqlite3 *pErrorDb_local;
  
  sParse.pWithToFree._4_4_ = sqlite3FindDbName(pDb,zDb);
  if (sParse.pWithToFree._4_4_ == 1) {
    memset(auStack_280,0,0x250);
    _auStack_280 = pDb;
    iVar1 = sqlite3OpenTempDatabase((Parse *)auStack_280);
    if (iVar1 != 0) {
      sqlite3ErrorWithMsg(pErrorDb,(int)sParse.pVdbe,"%s",sParse.db);
    }
    sqlite3DbFree(pErrorDb,sParse.db);
    sqlite3ParserReset((Parse *)auStack_280);
    if (iVar1 != 0) {
      return (Btree *)0x0;
    }
  }
  if (sParse.pWithToFree._4_4_ < 0) {
    sqlite3ErrorWithMsg(pErrorDb,1,"unknown database %s",zDb);
    pErrorDb_local = (sqlite3 *)0x0;
  }
  else {
    pErrorDb_local = (sqlite3 *)pDb->aDb[sParse.pWithToFree._4_4_].pBt;
  }
  return (Btree *)pErrorDb_local;
}

Assistant:

static Btree *findBtree(sqlite3 *pErrorDb, sqlite3 *pDb, const char *zDb){
  int i = sqlite3FindDbName(pDb, zDb);

  if( i==1 ){
    Parse sParse;
    int rc = 0;
    memset(&sParse, 0, sizeof(sParse));
    sParse.db = pDb;
    if( sqlite3OpenTempDatabase(&sParse) ){
      sqlite3ErrorWithMsg(pErrorDb, sParse.rc, "%s", sParse.zErrMsg);
      rc = SQLITE_ERROR;
    }
    sqlite3DbFree(pErrorDb, sParse.zErrMsg);
    sqlite3ParserReset(&sParse);
    if( rc ){
      return 0;
    }
  }

  if( i<0 ){
    sqlite3ErrorWithMsg(pErrorDb, SQLITE_ERROR, "unknown database %s", zDb);
    return 0;
  }

  return pDb->aDb[i].pBt;
}